

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

void __thiscall indk::NeuralNet::setStructure(NeuralNet *this,ifstream *Stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  string rstr;
  string jstr;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    iVar4 = System::getVerbosityLevel();
    if (0 < iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error opening file",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      return;
    }
  }
  else {
    paVar1 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    lVar2 = *(long *)Stream;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    if (((byte)Stream[*(long *)(lVar2 + -0x18) + 0x20] & 2) == 0) {
      do {
        local_68 = 0;
        local_60 = 0;
        local_70 = &local_60;
        cVar3 = std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + (char)Stream);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)Stream,(string *)&local_70,cVar3);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
        lVar2 = *(long *)Stream;
      } while (((byte)Stream[*(long *)(lVar2 + -0x18) + 0x20] & 2) == 0);
    }
    setStructure(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::setStructure(std::ifstream &Stream) {
    if (!Stream.is_open()) {
        if (indk::System::getVerbosityLevel() > 0) std::cerr << "Error opening file" << std::endl;
        return;
    }
    std::string jstr;
    while (!Stream.eof()) {
        std::string rstr;
        getline(Stream, rstr);
        jstr.append(rstr);
    }
    setStructure(jstr);
}